

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::setVolumeMass(btSoftBody *this,btScalar mass)

{
  float fVar1;
  float fVar2;
  int iVar3;
  Node *pNVar4;
  Tetra *pTVar5;
  float *pfVar6;
  long in_RDI;
  btScalar bVar7;
  int j;
  Tetra *t;
  int i;
  btAlignedObjectArray<float> ranks;
  btAlignedObjectArray<float> *in_stack_ffffffffffffff30;
  float *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  btAlignedObjectArray<float> *in_stack_ffffffffffffff50;
  Node *in_stack_ffffffffffffff68;
  btSoftBody *in_stack_ffffffffffffff70;
  int local_54;
  int local_44;
  btAlignedObjectArray<float> local_30;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  btAlignedObjectArray<float>::btAlignedObjectArray(in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Node>::size
            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  btAlignedObjectArray<float>::resize(in_stack_ffffffffffffff50,iVar3,in_stack_ffffffffffffff40);
  local_44 = 0;
  while( true ) {
    iVar3 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    if (iVar3 <= local_44) break;
    pNVar4 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_44);
    pNVar4->m_im = 0.0;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar3 = btAlignedObjectArray<btSoftBody::Tetra>::size
                      ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0));
    if (iVar3 <= local_44) break;
    pTVar5 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),local_44);
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      bVar7 = btFabs(pTVar5->m_rv);
      pTVar5->m_n[local_54]->m_im = pTVar5->m_n[local_54]->m_im + bVar7;
      in_stack_ffffffffffffff68 = pTVar5->m_n[local_54];
      in_stack_ffffffffffffff70 =
           (btSoftBody *)
           btAlignedObjectArray<btSoftBody::Node>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
      pfVar6 = btAlignedObjectArray<float>::operator[]
                         (&local_30,
                          (int)((ulong)((long)in_stack_ffffffffffffff68 -
                                       (long)in_stack_ffffffffffffff70) >> 3) * -0x11111111);
      *pfVar6 = *pfVar6 + 1.0;
    }
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar3 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    if (iVar3 <= local_44) break;
    pNVar4 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_44);
    if (0.0 < pNVar4->m_im) {
      pfVar6 = btAlignedObjectArray<float>::operator[](&local_30,local_44);
      fVar1 = *pfVar6;
      pNVar4 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_44);
      fVar2 = pNVar4->m_im;
      pNVar4 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_44);
      pNVar4->m_im = fVar1 / fVar2;
    }
    local_44 = local_44 + 1;
  }
  setTotalMass(in_stack_ffffffffffffff70,(btScalar)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
  btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x26d3ba);
  return;
}

Assistant:

void			btSoftBody::setVolumeMass(btScalar mass)
{
btAlignedObjectArray<btScalar>	ranks;
ranks.resize(m_nodes.size(),0);
int i;

for(i=0;i<m_nodes.size();++i)
	{
	m_nodes[i].m_im=0;
	}
for(i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		t.m_n[j]->m_im+=btFabs(t.m_rv);
		ranks[int(t.m_n[j]-&m_nodes[0])]+=1;
		}
	}
for( i=0;i<m_nodes.size();++i)
	{
	if(m_nodes[i].m_im>0)
		{
		m_nodes[i].m_im=ranks[i]/m_nodes[i].m_im;
		}
	}
setTotalMass(mass,false);
}